

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

bcf_hdr_t * vcf_hdr_read(htsFile *fp)

{
  bool bVar1;
  int iVar2;
  kstream_t *ks;
  size_t sVar3;
  ulong uVar4;
  kstring_t *pkVar5;
  ulong uVar6;
  byte *pbVar7;
  htsFile *tbx;
  char **__ptr;
  bcf_hrec_t *pbVar8;
  char *pcVar9;
  uint uVar10;
  kstring_t *htxt;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int dret;
  int n;
  bcf_hdr_t *local_88;
  int local_7c;
  htsFile *local_78;
  kstring_t *local_70;
  kstring_t local_68;
  undefined8 local_50;
  byte abStack_48 [24];
  
  local_88 = bcf_hdr_init("r");
  htxt = (kstring_t *)0x0;
  uVar11 = 0;
  uVar12 = 0;
  pkVar5 = &fp->line;
  local_70 = &fp->line;
  do {
    do {
      iVar2 = hts_getline(fp,2,pkVar5);
      if (iVar2 < 0) goto LAB_00115ea5;
    } while (pkVar5->l == 0);
    pcVar9 = (fp->line).s;
    if (*pcVar9 != '#') {
      if (1 < hts_verbose) {
        vcf_hdr_read_cold_1();
      }
      free(htxt);
      bcf_hdr_destroy(local_88);
      goto LAB_0011600a;
    }
    if ((pcVar9[1] != '#') && (fp->fn_aux != (char *)0x0)) {
      local_68.l = 0;
      local_68.m = 0;
      local_68.s = (char *)0x0;
      local_78 = fp;
      local_50 = (BGZF *)gzopen();
      ks = ks_init(local_50);
      while (iVar2 = ks_getuntil2(ks,0,&local_68,&local_7c,0), -1 < iVar2) {
        uVar4 = uVar12 + 0xe;
        pkVar5 = htxt;
        if (uVar4 < uVar11) {
LAB_00115a77:
          builtin_strncpy((char *)((long)&pkVar5->l + uVar12 + 5),"tig=<ID=",8);
          builtin_strncpy((char *)((long)&pkVar5->l + uVar12),"##contig",8);
          *(undefined1 *)((long)&pkVar5->m + uVar12 + 5) = 0;
          uVar12 = uVar12 + 0xd;
          htxt = pkVar5;
        }
        else {
          uVar4 = uVar4 >> 1 | uVar4;
          uVar4 = uVar4 >> 2 | uVar4;
          uVar4 = uVar4 >> 4 | uVar4;
          uVar4 = uVar4 >> 8 | uVar4;
          uVar11 = (uVar4 >> 0x10 | uVar4) + 1;
          pkVar5 = (kstring_t *)realloc(htxt,uVar11);
          if (pkVar5 != (kstring_t *)0x0) goto LAB_00115a77;
        }
        pcVar9 = local_68.s;
        sVar3 = strlen(local_68.s);
        sVar3 = (size_t)(int)sVar3;
        uVar4 = sVar3 + uVar12 + 1;
        pkVar5 = htxt;
        if (uVar4 < uVar11) {
LAB_00115b0b:
          htxt = pkVar5;
          memcpy((char *)((long)&htxt->l + uVar12),pcVar9,sVar3);
          uVar12 = uVar12 + sVar3;
          *(char *)((long)&htxt->l + uVar12) = '\0';
        }
        else {
          uVar4 = uVar4 >> 1 | uVar4;
          uVar4 = uVar4 >> 2 | uVar4;
          uVar4 = uVar4 >> 4 | uVar4;
          uVar4 = uVar4 >> 8 | uVar4;
          uVar11 = (uVar4 >> 0x10 | uVar4) + 1;
          pkVar5 = (kstring_t *)realloc(htxt,uVar11);
          if (pkVar5 != (kstring_t *)0x0) goto LAB_00115b0b;
        }
        ks_getuntil2(ks,0,&local_68,&local_7c,0);
        uVar4 = uVar12 + 9;
        pkVar5 = htxt;
        if (uVar4 < uVar11) {
LAB_00115b99:
          htxt = pkVar5;
          builtin_strncpy((char *)((long)&htxt->l + uVar12),",length=",8);
          *(undefined1 *)((long)&htxt->m + uVar12) = 0;
          uVar12 = uVar12 + 8;
        }
        else {
          uVar4 = uVar4 >> 1 | uVar4;
          uVar4 = uVar4 >> 2 | uVar4;
          uVar4 = uVar4 >> 4 | uVar4;
          uVar4 = uVar4 >> 8 | uVar4;
          uVar11 = (uVar4 >> 0x10 | uVar4) + 1;
          pkVar5 = (kstring_t *)realloc(htxt,uVar11);
          if (pkVar5 != (kstring_t *)0x0) goto LAB_00115b99;
        }
        uVar6 = atol(local_68.s);
        iVar2 = (int)uVar6;
        uVar4 = (ulong)(uint)-iVar2;
        if (0 < iVar2) {
          uVar4 = uVar6 & 0xffffffff;
        }
        uVar6 = 0;
        do {
          uVar10 = (uint)uVar4;
          abStack_48[uVar6] = (char)uVar4 + (char)(uVar4 / 10) * -10 | 0x30;
          uVar6 = uVar6 + 1;
          uVar4 = uVar4 / 10;
        } while (9 < uVar10);
        if (iVar2 < 0) {
          uVar4 = uVar6 & 0xffffffff;
          uVar6 = (ulong)((int)uVar6 + 1);
          abStack_48[uVar4] = 0x2d;
        }
        uVar4 = (long)(int)uVar6 + uVar12 + 1;
        pkVar5 = htxt;
        if (uVar4 < uVar11) {
LAB_00115c54:
          htxt = pkVar5;
          pbVar7 = abStack_48 + ((uVar6 & 0xffffffff) - 1);
          iVar2 = (int)uVar6 + 1;
          do {
            *(byte *)((long)&htxt->l + uVar12) = *pbVar7;
            uVar12 = uVar12 + 1;
            iVar2 = iVar2 + -1;
            pbVar7 = pbVar7 + -1;
          } while (1 < iVar2);
          *(char *)((long)&htxt->l + uVar12) = '\0';
        }
        else {
          uVar4 = uVar4 >> 1 | uVar4;
          uVar4 = uVar4 >> 2 | uVar4;
          uVar4 = uVar4 >> 4 | uVar4;
          uVar4 = uVar4 >> 8 | uVar4;
          uVar11 = (uVar4 >> 0x10 | uVar4) + 1;
          pkVar5 = (kstring_t *)realloc(htxt,uVar11);
          if (pkVar5 != (kstring_t *)0x0) goto LAB_00115c54;
        }
        uVar4 = uVar12 + 3;
        pkVar5 = htxt;
        if (uVar4 < uVar11) {
LAB_00115cd2:
          htxt = pkVar5;
          pcVar9 = (char *)((long)&htxt->l + uVar12);
          pcVar9[0] = '>';
          pcVar9[1] = '\n';
          *(char *)((long)&htxt->l + uVar12 + 2) = '\0';
          uVar12 = uVar12 + 2;
        }
        else {
          uVar4 = uVar4 >> 1 | uVar4;
          uVar4 = uVar4 >> 2 | uVar4;
          uVar4 = uVar4 >> 4 | uVar4;
          uVar4 = uVar4 >> 8 | uVar4;
          uVar11 = (uVar4 >> 0x10 | uVar4) + 1;
          pkVar5 = (kstring_t *)realloc(htxt,uVar11);
          if (pkVar5 != (kstring_t *)0x0) goto LAB_00115cd2;
        }
        if (local_7c != 10) {
          do {
            if (((*(uint *)&ks->field_0x8 & 3) == 0) || (uVar10 = 0xffffffff, ks->begin < ks->end))
            {
              if (ks->end <= ks->begin) {
                ks->begin = 0;
                iVar2 = gzread(ks->f,ks->buf,(int)*(uint *)&ks->field_0x8 >> 2);
                ks->end = iVar2;
                if (iVar2 == 0) {
                  *(uint *)&ks->field_0x8 = (*(uint *)&ks->field_0x8 & 0xfffffffc) + 1;
                  uVar10 = 0xffffffff;
                  goto LAB_00115d4b;
                }
              }
              ks->seek_pos = ks->seek_pos + 1;
              iVar2 = ks->begin;
              ks->begin = iVar2 + 1;
              uVar10 = (uint)ks->buf[iVar2];
            }
LAB_00115d4b:
          } while ((uVar10 != 10) && (uVar10 != 0xffffffff));
        }
      }
      free(local_68.s);
      ks_destroy(ks);
      gzclose(local_50);
      fp = local_78;
    }
    pcVar9 = (fp->line).s;
    sVar3 = (size_t)(int)(fp->line).l;
    uVar4 = sVar3 + uVar12 + 1;
    pkVar5 = htxt;
    if (uVar4 < uVar11) {
LAB_00115e0e:
      memcpy((char *)((long)&pkVar5->l + uVar12),pcVar9,sVar3);
      uVar12 = uVar12 + sVar3;
      *(char *)((long)&pkVar5->l + uVar12) = '\0';
      htxt = pkVar5;
    }
    else {
      uVar4 = uVar4 >> 1 | uVar4;
      uVar4 = uVar4 >> 2 | uVar4;
      uVar4 = uVar4 >> 4 | uVar4;
      uVar4 = uVar4 >> 8 | uVar4;
      uVar11 = (uVar4 >> 0x10 | uVar4) + 1;
      pkVar5 = (kstring_t *)realloc(htxt,uVar11);
      if (pkVar5 != (kstring_t *)0x0) goto LAB_00115e0e;
    }
    uVar4 = uVar12 + 1;
    pkVar5 = htxt;
    if (uVar4 < uVar11) {
LAB_00115e7b:
      pcVar9 = (char *)((long)&pkVar5->l + uVar12);
      pcVar9[0] = '\n';
      pcVar9[1] = '\0';
      uVar12 = uVar4;
      htxt = pkVar5;
    }
    else {
      uVar11 = uVar4 >> 1 | uVar4;
      uVar11 = uVar11 >> 2 | uVar11;
      uVar11 = uVar11 >> 4 | uVar11;
      uVar11 = uVar11 >> 8 | uVar11;
      uVar11 = (uVar11 >> 0x10 | uVar11) + 1;
      pkVar5 = (kstring_t *)realloc(htxt,uVar11);
      if (pkVar5 != (kstring_t *)0x0) goto LAB_00115e7b;
    }
    pkVar5 = local_70;
  } while ((fp->line).s[1] == '#');
LAB_00115ea5:
  if (htxt == (kstring_t *)0x0) {
    vcf_hdr_read_cold_2();
LAB_0011600a:
    local_88 = (bcf_hdr_t *)0x0;
  }
  else {
    bcf_hdr_parse(local_88,(char *)htxt);
    tbx = (htsFile *)tbx_index_load(fp->fn);
    if (tbx != (htsFile *)0x0) {
      local_70 = htxt;
      __ptr = tbx_seqnames((tbx_t *)tbx,(int *)&local_68);
      if ((int)local_68.l < 1) {
        free(__ptr);
        tbx_destroy((tbx_t *)tbx);
        htxt = local_70;
      }
      else {
        lVar13 = 0;
        bVar1 = false;
        local_78 = tbx;
        do {
          pbVar8 = bcf_hdr_get_hrec(local_88,3,"ID",__ptr[lVar13],(char *)0x0);
          if (pbVar8 == (bcf_hrec_t *)0x0) {
            pbVar8 = (bcf_hrec_t *)calloc(1,0x30);
            pcVar9 = strdup("contig");
            pbVar8->key = pcVar9;
            bcf_hrec_add_key(pbVar8,"ID",2);
            iVar2 = pbVar8->nkeys;
            pcVar9 = __ptr[lVar13];
            sVar3 = strlen(pcVar9);
            bcf_hrec_set_val(pbVar8,iVar2 + -1,pcVar9,(int)sVar3,0);
            bcf_hdr_add_hrec(local_88,pbVar8);
            bVar1 = true;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < (int)local_68.l);
        free(__ptr);
        tbx_destroy((tbx_t *)local_78);
        htxt = local_70;
        if (bVar1) {
          bcf_hdr_sync(local_88);
          htxt = local_70;
        }
      }
    }
    free(htxt);
  }
  return local_88;
}

Assistant:

bcf_hdr_t *vcf_hdr_read(htsFile *fp)
{
    kstring_t txt, *s = &fp->line;
    bcf_hdr_t *h;
    h = bcf_hdr_init("r");
    txt.l = txt.m = 0; txt.s = 0;
    while (hts_getline(fp, KS_SEP_LINE, s) >= 0) {
        if (s->l == 0) continue;
        if (s->s[0] != '#') {
            if (hts_verbose >= 2)
                fprintf(stderr, "[E::%s] no sample line\n", __func__);
            free(txt.s);
            bcf_hdr_destroy(h);
            return 0;
        }
        if (s->s[1] != '#' && fp->fn_aux) { // insert contigs here
            int dret;
            gzFile f;
            kstream_t *ks;
            kstring_t tmp;
            tmp.l = tmp.m = 0; tmp.s = 0;
            f = gzopen(fp->fn_aux, "r");
            ks = ks_init(f);
            while (ks_getuntil(ks, 0, &tmp, &dret) >= 0) {
                int c;
                kputs("##contig=<ID=", &txt); kputs(tmp.s, &txt);
                ks_getuntil(ks, 0, &tmp, &dret);
                kputs(",length=", &txt); kputw(atol(tmp.s), &txt);
                kputsn(">\n", 2, &txt);
                if (dret != '\n')
                    while ((c = ks_getc(ks)) != '\n' && c != -1); // skip the rest of the line
            }
            free(tmp.s);
            ks_destroy(ks);
            gzclose(f);
        }
        kputsn(s->s, s->l, &txt);
        kputc('\n', &txt);
        if (s->s[1] != '#') break;
    }
    if ( !txt.s )
    {
        fprintf(stderr,"[%s:%d %s] Could not read the header\n", __FILE__,__LINE__,__FUNCTION__);
        return NULL;
    }
    bcf_hdr_parse(h, txt.s);

    // check tabix index, are all contigs listed in the header? add the missing ones
    tbx_t *idx = tbx_index_load(fp->fn);
    if ( idx )
    {
        int i, n, need_sync = 0;
        const char **names = tbx_seqnames(idx, &n);
        for (i=0; i<n; i++)
        {
            bcf_hrec_t *hrec = bcf_hdr_get_hrec(h, BCF_HL_CTG, "ID", (char*) names[i], NULL);
            if ( hrec ) continue;
            hrec = (bcf_hrec_t*) calloc(1,sizeof(bcf_hrec_t));
            hrec->key = strdup("contig");
            bcf_hrec_add_key(hrec, "ID", strlen("ID"));
            bcf_hrec_set_val(hrec, hrec->nkeys-1, (char*) names[i], strlen(names[i]), 0);
            bcf_hdr_add_hrec(h, hrec);
            need_sync = 1;
        }
        free(names);
        tbx_destroy(idx);
        if ( need_sync )
            bcf_hdr_sync(h);
    }
    free(txt.s);
    return h;
}